

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ProcessExtensions(void *user_data,spv_parsed_instruction_t *inst)

{
  ValidationState_t *_;
  Op opcode;
  spv_parsed_instruction_t *inst_local;
  void *user_data_local;
  
  if (inst->opcode == 0x11) {
    user_data_local._4_4_ = SPV_SUCCESS;
  }
  else if (inst->opcode == 10) {
    RegisterExtension((ValidationState_t *)user_data,inst);
    user_data_local._4_4_ = SPV_SUCCESS;
  }
  else {
    user_data_local._4_4_ = SPV_REQUESTED_TERMINATION;
  }
  return user_data_local._4_4_;
}

Assistant:

spv_result_t ProcessExtensions(void* user_data,
                               const spv_parsed_instruction_t* inst) {
  const spv::Op opcode = static_cast<spv::Op>(inst->opcode);
  if (opcode == spv::Op::OpCapability) return SPV_SUCCESS;

  if (opcode == spv::Op::OpExtension) {
    ValidationState_t& _ = *(reinterpret_cast<ValidationState_t*>(user_data));
    RegisterExtension(_, inst);
    return SPV_SUCCESS;
  }

  // OpExtension block is finished, requesting termination.
  return SPV_REQUESTED_TERMINATION;
}